

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sim_circuit.cpp
# Opt level: O0

SimComponent * __thiscall lsim::SimCircuit::add_component(SimCircuit *this,ModelComponent *comp)

{
  ComponentType CVar1;
  uint32_t uVar2;
  pin_t pVar3;
  pin_t pVar4;
  SimComponent *this_00;
  mapped_type *ppSVar5;
  Simulator *pSVar6;
  pointer pSVar7;
  ulong uVar8;
  size_t sVar9;
  ModelCircuit *pMVar10;
  pin_id_t pVar11;
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> local_58;
  pin_t local_4c;
  uint local_48;
  pin_t nested_pin_1;
  uint idx_1;
  pin_t nested_pin;
  uint idx;
  undefined1 local_30 [8];
  unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> nested_instance;
  SimComponent *sim_comp;
  ModelComponent *comp_local;
  SimCircuit *this_local;
  
  if (comp != (ModelComponent *)0x0) {
    this_00 = Simulator::create_component(this->m_sim,comp);
    nested_instance._M_t.
    super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>._M_t.
    super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>.
    super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl._4_4_ = ModelComponent::id(comp);
    ppSVar5 = std::
              unordered_map<unsigned_int,_lsim::SimComponent_*,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_lsim::SimComponent_*>_>_>
              ::operator[](&this->m_components,
                           (key_type *)
                           ((long)&nested_instance._M_t.
                                   super___uniq_ptr_impl<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_lsim::SimCircuit_*,_std::default_delete<lsim::SimCircuit>_>
                                   .super__Head_base<0UL,_lsim::SimCircuit_*,_false>._M_head_impl +
                           4));
    *ppSVar5 = this_00;
    CVar1 = ModelComponent::type(comp);
    if (CVar1 == 0x301) {
      pSVar6 = (Simulator *)ModelComponent::nested_circuit(comp);
      ModelCircuit::instantiate((ModelCircuit *)local_30,pSVar6,SUB81(this->m_sim,0));
      pSVar7 = std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::operator->
                         ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                          local_30);
      uVar2 = ModelComponent::id(comp);
      build_name(pSVar7,uVar2);
      idx_1 = 0;
      while( true ) {
        uVar8 = (ulong)idx_1;
        sVar9 = SimComponent::num_inputs(this_00);
        if (sVar9 <= uVar8) break;
        pSVar7 = std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::
                 operator->((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                            local_30);
        pMVar10 = ModelComponent::nested_circuit(comp);
        pVar11 = ModelCircuit::port_by_index(pMVar10,true,(ulong)idx_1);
        pVar3 = pin_from_pin_id(pSVar7,pVar11);
        pSVar6 = this->m_sim;
        nested_pin_1 = pVar3;
        uVar2 = SimComponent::input_pin_index(this_00,idx_1);
        pVar4 = SimComponent::pin_by_index(this_00,uVar2);
        Simulator::connect_pins(pSVar6,pVar3,pVar4);
        idx_1 = idx_1 + 1;
      }
      local_48 = 0;
      while( true ) {
        uVar8 = (ulong)local_48;
        sVar9 = SimComponent::num_outputs(this_00);
        if (sVar9 <= uVar8) break;
        pSVar7 = std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::
                 operator->((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)
                            local_30);
        pMVar10 = ModelComponent::nested_circuit(comp);
        pVar11 = ModelCircuit::port_by_index(pMVar10,false,(ulong)local_48);
        pVar3 = pin_from_pin_id(pSVar7,pVar11);
        pSVar6 = this->m_sim;
        local_4c = pVar3;
        uVar2 = SimComponent::output_pin_index(this_00,local_48);
        pVar4 = SimComponent::pin_by_index(this_00,uVar2);
        Simulator::connect_pins(pSVar6,pVar3,pVar4);
        local_48 = local_48 + 1;
      }
      std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::unique_ptr
                (&local_58,
                 (unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)local_30);
      SimComponent::set_nested_instance(this_00,&local_58);
      std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::~unique_ptr
                (&local_58);
      std::unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_>::~unique_ptr
                ((unique_ptr<lsim::SimCircuit,_std::default_delete<lsim::SimCircuit>_> *)local_30);
    }
    return this_00;
  }
  __assert_fail("comp",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/sim_circuit.cpp"
                ,0x16,"SimComponent *lsim::SimCircuit::add_component(ModelComponent *)");
}

Assistant:

SimComponent *SimCircuit::add_component(ModelComponent *comp) {
    assert(comp);
    auto sim_comp = m_sim->create_component(comp);
    m_components[comp->id()] = sim_comp;

    if (comp->type() == COMPONENT_SUB_CIRCUIT) {
        auto nested_instance = comp->nested_circuit()->instantiate(m_sim, false);
        nested_instance->build_name(comp->id());

        for (auto idx = 0u; idx < sim_comp->num_inputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(true, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->input_pin_index(idx)));
        }        

        for (auto idx = 0u; idx < sim_comp->num_outputs(); ++idx) {
            auto nested_pin = nested_instance->pin_from_pin_id(comp->nested_circuit()->port_by_index(false, idx));
            m_sim->connect_pins(nested_pin, sim_comp->pin_by_index(sim_comp->output_pin_index(idx)));
        }        

        sim_comp->set_nested_instance(std::move(nested_instance));
    }
    return sim_comp;
}